

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O0

void calc_mean_and_sd_weighted<float,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,double>
               (size_t *ix_arr,size_t st,size_t end,float *x,
               robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
               *w,MissingAction missing_action,double *x_sd,double *x_mean)

{
  float fVar1;
  double __x;
  uint uVar2;
  int iVar3;
  double *pdVar4;
  long in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  double __value;
  double *in_stack_00000008;
  size_t row;
  double xval;
  double m_prev;
  double s;
  double m;
  double w_this;
  double cnt;
  unsigned_long *in_stack_ffffffffffffff88;
  undefined6 in_stack_ffffffffffffff90;
  byte bVar5;
  bool bVar6;
  undefined1 uVar7;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_10;
  
  local_38 = 0.0;
  local_48 = 0.0;
  local_50 = 0.0;
  fVar1 = *(float *)(in_RCX + *(long *)(in_RDI + in_RSI * 8) * 4);
  local_10 = in_RSI;
  do {
    local_58 = (double)fVar1;
    uVar2 = std::isnan(local_58);
    if ((uVar2 & 1) == 0) {
      uVar2 = std::isinf(local_58);
      bVar6 = false;
      if ((uVar2 & 1) != 0) goto LAB_00479e08;
    }
    else {
LAB_00479e08:
      bVar6 = local_10 <= in_RDX;
    }
    if (!bVar6) {
      uVar7 = 0;
      for (local_68 = local_10; local_68 <= in_RDX; local_68 = local_68 + 1) {
        __value = (double)*(float *)(in_RCX + *(long *)(in_RDI + local_68 * 8) * 4);
        uVar2 = std::isnan(__value);
        bVar5 = 1;
        if ((uVar2 & 1) == 0) {
          iVar3 = std::isinf(__value);
          bVar5 = (byte)iVar3;
        }
        if (((bVar5 ^ 0xff) & 1) != 0) {
          pdVar4 = tsl::
                   robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                   ::operator[]((robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                                 *)CONCAT17(uVar7,CONCAT16(bVar5,in_stack_ffffffffffffff90)),
                                in_stack_ffffffffffffff88);
          __x = *pdVar4;
          local_38 = __x + local_38;
          local_48 = fma(__x,(__value - local_48) / local_38,local_48);
          local_50 = fma(__x,(__value - local_48) * (__value - local_58),local_50);
          local_58 = local_48;
        }
      }
      *(double *)row = local_48;
      *in_stack_00000008 = SQRT(local_50 / local_38);
      return;
    }
    fVar1 = *(float *)(in_RCX + *(long *)(in_RDI + 8 + local_10 * 8) * 4);
    local_10 = local_10 + 1;
  } while( true );
}

Assistant:

void calc_mean_and_sd_weighted(size_t ix_arr[], size_t st, size_t end, real_t_ *restrict x, mapping &restrict w,
                               MissingAction missing_action, double &restrict x_sd, double &restrict x_mean)
{
    ldouble_safe cnt = 0;
    ldouble_safe w_this;
    ldouble_safe m = 0;
    ldouble_safe s = 0;
    ldouble_safe m_prev = x[ix_arr[st]];
    ldouble_safe xval;
    while (is_na_or_inf(m_prev) && st <= end)
    {
        m_prev = x[ix_arr[++st]];
    }

    for (size_t row = st; row <= end; row++)
    {
        xval = x[ix_arr[row]];
        if (likely(!is_na_or_inf(xval)))
        {
            w_this = w[ix_arr[row]];
            cnt += w_this;
            m = std::fma(w_this, (xval - m) / cnt, m);
            s = std::fma(w_this, (xval - m) * (xval - m_prev), s);
            m_prev = m;
        }
    }

    x_mean = m;
    x_sd   = std::sqrt((ldouble_safe)s / (ldouble_safe)cnt);
}